

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

string * __thiscall
flatbuffers::cpp::CppGenerator::UnionUnPackSignature_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,EnumDef *enum_def,bool inclass)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined7 in_register_00000009;
  char *pcVar4;
  ulong *puVar5;
  size_type *psVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"void *","");
  pcVar4 = "";
  if ((int)CONCAT71(in_register_00000009,inclass) != 0) {
    pcVar4 = "static ";
  }
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,(ulong)pcVar4);
  local_110 = &local_100;
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_100 = *puVar5;
    uStack_f8 = (undefined4)plVar2[3];
    uStack_f4 = *(undefined4 *)((long)plVar2 + 0x1c);
  }
  else {
    local_100 = *puVar5;
    local_110 = (ulong *)*plVar2;
  }
  local_108 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (inclass) {
    local_130 = &local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  }
  else {
    EscapeKeyword(&local_70,this,(string *)enum_def);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_130 = &local_120;
    puVar5 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar5) {
      local_120 = *puVar5;
      lStack_118 = plVar2[3];
    }
    else {
      local_120 = *puVar5;
      local_130 = (ulong *)*plVar2;
    }
    local_128 = plVar2[1];
    *plVar2 = (long)puVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
  }
  uVar7 = 0xf;
  if (local_110 != &local_100) {
    uVar7 = local_100;
  }
  if (uVar7 < (ulong)(local_128 + local_108)) {
    uVar7 = 0xf;
    if (local_130 != &local_120) {
      uVar7 = local_120;
    }
    if (uVar7 < (ulong)(local_128 + local_108)) goto LAB_0017c5ce;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0017c5ce:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_130);
  }
  local_f0 = &local_e0;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_e0 = *plVar2;
    uStack_d8 = puVar3[3];
  }
  else {
    local_e0 = *plVar2;
    local_f0 = (long *)*puVar3;
  }
  local_e8 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f0);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_a0 = *puVar5;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar5;
    local_b0 = (ulong *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  EscapeKeyword(&local_90,this,(string *)enum_def);
  uVar7 = 0xf;
  if (local_b0 != &local_a0) {
    uVar7 = local_a0;
  }
  if (uVar7 < local_90._M_string_length + local_a8) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar8 = local_90.field_2._M_allocated_capacity;
    }
    if (local_90._M_string_length + local_a8 <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
      goto LAB_0017c722;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90._M_dataplus._M_p);
LAB_0017c722:
  local_d0 = &local_c0;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_c0 = *plVar2;
    uStack_b8 = puVar3[3];
  }
  else {
    local_c0 = *plVar2;
    local_d0 = (long *)*puVar3;
  }
  local_c8 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar6) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((!inclass) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UnionUnPackSignature(const EnumDef &enum_def, bool inclass) {
    return (inclass ? "static " : "") + std::string("void *") +
           (inclass ? "" : Name(enum_def) + "Union::") +
           "UnPack(const void *obj, " + Name(enum_def) +
           " type, const ::flatbuffers::resolver_function_t *resolver)";
  }